

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimingCheckEventConditionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingCheckEventConditionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Token tripleAnd;
  TimingCheckEventConditionSyntax *pTVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pTVar1 = (TimingCheckEventConditionSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  tripleAnd.info = in_RSI;
  tripleAnd._0_8_ = in_RDX;
  slang::syntax::TimingCheckEventConditionSyntax::TimingCheckEventConditionSyntax
            ((TimingCheckEventConditionSyntax *)in_RSI->location,tripleAnd,
             (ExpressionSyntax *)in_RSI->rawTextPtr);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }